

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepFace::Read(ON_BrepFace *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int i;
  uint local_1c;
  
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_face_index);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_li), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_si), bVar1)) {
    local_1c = (uint)this->m_bRev;
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_1c);
    if (bVar1) {
      this->m_bRev = local_1c != 0;
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_face_material_channel);
      if (-1 < this->m_face_material_channel) {
        return bVar1;
      }
      this->m_face_material_channel = 0;
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_BrepFace::Read( ON_BinaryArchive& file )
{
  int i;
  bool rc = file.ReadInt( &m_face_index );
  if ( rc )
    rc = file.ReadArray( m_li );
  if ( rc )
    rc = file.ReadInt( &m_si );
  if ( rc )
  {
    i = m_bRev;
    rc = file.ReadInt( &i );
    if ( rc )
      m_bRev = (i!=0);
  }
  if ( rc )
  {
    rc = file.ReadInt( &m_face_material_channel );
    if ( m_face_material_channel < 0 )
      m_face_material_channel = 0;
  }
  return rc;
}